

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrInv.c
# Opt level: O2

void Pdr_ManVerifyInvariant(Pdr_Man_t *p)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  abctime aVar4;
  Vec_Ptr_t *p_00;
  sat_solver *s;
  Pdr_Set_t *pPVar5;
  Vec_Int_t *pVVar6;
  abctime aVar7;
  abctime time;
  uint uVar8;
  uint uVar9;
  char *pStr;
  sat_solver *psVar10;
  uint uVar11;
  
  aVar4 = Abc_Clock();
  iVar2 = Pdr_ManFindInvariantStart(p);
  p_00 = Pdr_ManCollectCubes(p,iVar2);
  iVar2 = p->vSolvers->nSize;
  psVar10 = (sat_solver *)p;
  s = Pdr_ManCreateSolver(p,iVar2);
  uVar1 = p_00->nSize;
  uVar9 = 0;
  uVar8 = 0;
  if (0 < (int)uVar1) {
    uVar8 = uVar1;
  }
  while( true ) {
    if (uVar8 == uVar9) {
      uVar11 = 0;
      for (uVar9 = 0; uVar8 != uVar9; uVar9 = uVar9 + 1) {
        pPVar5 = (Pdr_Set_t *)Vec_PtrEntry(p_00,uVar9);
        pVVar6 = Pdr_ManCubeToLits(p,iVar2,pPVar5,0,1);
        psVar10 = s;
        iVar3 = sat_solver_solve(s,pVVar6->pArray,pVVar6->pArray + pVVar6->nSize,0,0,0,0);
        if (iVar3 != -1) {
          Abc_Print((int)psVar10,"Verification of clause %d failed.\n",(ulong)uVar9);
          uVar11 = uVar11 + 1;
        }
      }
      if (uVar11 == 0) {
        pStr = "Verification of invariant with %d clauses was successful.  ";
        Abc_Print((int)psVar10,"Verification of invariant with %d clauses was successful.  ",
                  (ulong)uVar1);
        aVar7 = Abc_Clock();
        Abc_PrintTime((int)aVar7 - (int)aVar4,pStr,time);
      }
      else {
        Abc_Print((int)psVar10,"Verification of %d clauses has failed.\n",(ulong)uVar11);
      }
      Vec_PtrFree(p_00);
      return;
    }
    pPVar5 = (Pdr_Set_t *)Vec_PtrEntry(p_00,uVar9);
    pVVar6 = Pdr_ManCubeToLits(p,iVar2,pPVar5,1,0);
    iVar3 = sat_solver_addclause(s,pVVar6->pArray,pVVar6->pArray + pVVar6->nSize);
    if (iVar3 == 0) break;
    psVar10 = s;
    sat_solver_compress(s);
    uVar9 = uVar9 + 1;
  }
  __assert_fail("RetValue",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrInv.c"
                ,0x209,"void Pdr_ManVerifyInvariant(Pdr_Man_t *)");
}

Assistant:

void Pdr_ManVerifyInvariant( Pdr_Man_t * p )
{
    sat_solver * pSat;
    Vec_Int_t * vLits;
    Vec_Ptr_t * vCubes;
    Pdr_Set_t * pCube;
    int i, kStart, kThis, RetValue, Counter = 0;
    abctime clk = Abc_Clock();
    // collect cubes used in the inductive invariant
    kStart = Pdr_ManFindInvariantStart( p );
    vCubes = Pdr_ManCollectCubes( p, kStart );
    // create solver with the cubes
    kThis = Vec_PtrSize(p->vSolvers);
    pSat  = Pdr_ManCreateSolver( p, kThis );
    // add the property output
//    Pdr_ManSetPropertyOutput( p, kThis );
    // add the clauses
    Vec_PtrForEachEntry( Pdr_Set_t *, vCubes, pCube, i )
    {
        vLits = Pdr_ManCubeToLits( p, kThis, pCube, 1, 0 );
        RetValue = sat_solver_addclause( pSat, Vec_IntArray(vLits), Vec_IntArray(vLits) + Vec_IntSize(vLits) );
        assert( RetValue );
        sat_solver_compress( pSat );
    }
    // check each clause
    Vec_PtrForEachEntry( Pdr_Set_t *, vCubes, pCube, i )
    {
        vLits = Pdr_ManCubeToLits( p, kThis, pCube, 0, 1 );
        RetValue = sat_solver_solve( pSat, Vec_IntArray(vLits), Vec_IntArray(vLits) + Vec_IntSize(vLits), 0, 0, 0, 0 );
        if ( RetValue != l_False )
        {
            Abc_Print( 1, "Verification of clause %d failed.\n", i );
            Counter++;
        }
    }
    if ( Counter )
        Abc_Print( 1, "Verification of %d clauses has failed.\n", Counter );
    else
    {
        Abc_Print( 1, "Verification of invariant with %d clauses was successful.  ", Vec_PtrSize(vCubes) );
        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    }
//    sat_solver_delete( pSat );
    Vec_PtrFree( vCubes );
}